

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  IRIns *ir;
  char *pcVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  undefined4 uVar5;
  SnapShot *pSVar6;
  IRIns *pIVar7;
  bool bVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  IRRef1 IVar12;
  uint uVar13;
  TRef TVar14;
  TRef TVar15;
  TRef TVar16;
  uint uVar17;
  SnapEntry *map;
  IRIns *pIVar18;
  ulong uVar19;
  ulong uVar20;
  IRIns *pIVar21;
  IRIns *irs;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  IRIns *pIVar25;
  ulong local_70;
  
  pSVar6 = T->snap;
  uVar4 = J->exitno;
  map = T->snapmap + pSVar6[uVar4].mapofs;
  bVar2 = pSVar6[uVar4].nent;
  uVar19 = (ulong)bVar2;
  J->framedepth = 0;
  bVar8 = false;
  local_70 = 0;
  for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
    uVar17 = map[uVar20];
    uVar22 = uVar17 >> 0x18;
    pIVar25 = (IRIns *)((ulong)((uVar17 & 0xffff) * 8) + (long)T->ir);
    if (((local_70 >> ((ulong)uVar17 & 0x3f) & 1) == 0) ||
       (uVar13 = snap_dedup(J,map,(MSize)uVar20,uVar17 & 0xffff), uVar13 == 0)) {
      local_70 = 1L << ((byte)uVar17 & 0x3f) | local_70;
      if ((uVar17 & 0xffff) < 0x8000) {
        uVar13 = 0;
        if (uVar17 != 0x1057fff) {
          uVar13 = snap_replay_const(J,pIVar25);
        }
      }
      else if (((pIVar25->field_0).prev & 0xff80) == 0x80) {
        bVar8 = true;
        uVar13 = uVar22;
      }
      else {
        uVar10 = 0x21;
        if ((pIVar25->field_1).o == 'G') {
          uVar10 = (pIVar25->field_0).op2 & 0x10 | 0x21;
        }
        (J->fold).ins.field_0.ot = (pIVar25->field_1).t.irt & 0x1f | 0x4700;
        *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar17 >> 0x18);
        (J->fold).ins.field_0.op2 = (ushort)(uVar17 >> 0xe) & 0x40 | uVar10;
        uVar13 = lj_ir_emit(J);
      }
    }
    J->slot[uVar22] = uVar17 & 0x130000 | uVar13;
    J->framedepth = J->framedepth + (uint)(uVar22 != 1 && (uVar17 & 0x30000) != 0);
    if ((uVar17 >> 0x10 & 1) != 0) {
      J->baseslot = uVar22 + 1;
    }
  }
  bVar9 = true;
  if (bVar8) {
    uVar10 = pSVar6[uVar4].ref;
    pIVar25 = T->ir;
    bVar8 = false;
    for (uVar20 = 0; uVar17 = (uint)bVar2, uVar20 != uVar19; uVar20 = uVar20 + 1) {
      uVar22 = map[uVar20];
      uVar13 = uVar22 & 0xffff;
      pIVar18 = T->ir;
      pIVar21 = pIVar18 + uVar13;
      if ((pIVar21->field_1).r == 0xfd) {
        if (J->slot[uVar22 >> 0x18] == uVar22 >> 0x18) {
          uVar22 = T->nk;
          if (uVar22 <= (pIVar21->field_0).op1) {
            snap_pref(J,T,map,uVar17,local_70,(uint)(pIVar21->field_0).op1);
            uVar22 = T->nk;
          }
          if (uVar22 <= (pIVar21->field_0).op2) {
            snap_pref(J,T,map,uVar17,local_70,(uint)(pIVar21->field_0).op2);
          }
          bVar8 = true;
          if ((pIVar21->field_1).o != 'T') {
            for (pIVar18 = pIVar18 + (ulong)uVar13 + 1; pIVar18 < pIVar25 + uVar10;
                pIVar18 = pIVar18 + 1) {
              if ((pIVar18->field_1).r == 0xfe) {
                if ((ulong)(pIVar18->field_1).s == 0xff) {
                  uVar22 = snap_sunk_store2(T,pIVar21,pIVar18);
                }
                else {
                  uVar22 = (uint)(pIVar18 == pIVar21 + (pIVar18->field_1).s);
                }
                if ((uVar22 != 0) &&
                   (TVar14 = snap_pref(J,T,map,uVar17,local_70,(uint)(pIVar18->field_0).op2),
                   TVar14 == 0)) {
                  snap_pref(J,T,map,uVar17,local_70,(uint)T->ir[(pIVar18->field_0).op2].field_0.op1)
                  ;
                }
              }
            }
            bVar8 = true;
          }
        }
      }
      else if ((0x7fff < uVar13) && (((pIVar21->field_0).prev & 0xff80) == 0x80)) {
        TVar14 = snap_pref(J,T,map,uVar17,local_70,(uint)(pIVar21->field_0).op1);
        J->slot[uVar22 >> 0x18] = TVar14;
      }
    }
    bVar9 = true;
    if (bVar8) {
      for (uVar20 = 0; bVar9 = !bVar8, uVar20 != uVar19; uVar20 = uVar20 + 1) {
        uVar23 = (ulong)(map[uVar20] & 0xffff);
        pIVar18 = T->ir;
        if (*(char *)((long)pIVar18 + uVar23 * 8 + 6) == -3) {
          uVar22 = map[uVar20] >> 0x18;
          if (J->slot[uVar22] == uVar22) {
            pIVar21 = pIVar18 + uVar23;
            uVar24 = (pIVar21->field_0).op1;
            uVar13 = T->nk;
            if (uVar13 <= uVar24) {
              TVar14 = snap_pref(J,T,map,uVar17,local_70,(uint)uVar24);
              uVar24 = (ushort)TVar14;
              uVar13 = T->nk;
            }
            uVar11 = (pIVar21->field_0).op2;
            if (uVar13 <= uVar11) {
              TVar14 = snap_pref(J,T,map,uVar17,local_70,(uint)uVar11);
              uVar11 = (ushort)TVar14;
            }
            if ((pIVar21->field_1).o != 'T') {
              (J->fold).ins.field_0.ot = (pIVar21->field_0).ot;
              (J->fold).ins.field_0.op1 = uVar24;
              (J->fold).ins.field_0.op2 = uVar11;
              TVar14 = lj_opt_fold(J);
              J->slot[uVar22] = TVar14;
              pIVar18 = pIVar18 + uVar23;
LAB_0014e600:
              irs = pIVar18 + 1;
              if (irs < pIVar25 + uVar10) {
                if (*(char *)((long)pIVar18 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar18 + 0xf) == 0xff) {
                    uVar22 = snap_sunk_store2(T,pIVar21,irs);
                  }
                  else {
                    uVar22 = (uint)(irs == pIVar21 + *(byte *)((long)pIVar18 + 0xf));
                  }
                  if (uVar22 != 0) {
                    pIVar7 = T->ir;
                    uVar23 = (ulong)(irs->field_0).op1;
                    uVar24 = *(ushort *)((long)pIVar7 + uVar23 * 8 + 2);
                    cVar3 = *(char *)((long)pIVar7 + uVar23 * 8 + 5);
                    IVar12 = (IRRef1)TVar14;
                    if (cVar3 != '>') {
                      ir = pIVar7 + uVar24;
                      if (cVar3 == '9') {
                        TVar15 = snap_replay_const(J,pIVar7 + (ir->field_0).op1);
                        TVar15 = lj_ir_kslot(J,TVar15,(uint)(ir->field_0).op2);
                        uVar24 = (ushort)TVar15;
                      }
                      else {
                        TVar15 = snap_replay_const(J,ir);
                        uVar24 = (ushort)TVar15;
                      }
                      if ((*(byte *)((long)pIVar7 + uVar23 * 8 + 5) & 0xfe) == 0x38) {
                        uVar5 = *(undefined4 *)
                                 ((long)T->ir + (ulong)pIVar7[uVar23].field_0.op1 * 8 + 2);
                        (J->fold).ins.field_0.op1 = IVar12;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar5;
                        TVar15 = lj_opt_fold(J);
                        IVar12 = (IRRef1)TVar15;
                      }
                    }
                    (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar7 + uVar23 * 8 + 4);
                    (J->fold).ins.field_0.op1 = IVar12;
                    (J->fold).ins.field_0.op2 = uVar24;
                    TVar15 = lj_opt_fold(J);
                    TVar16 = snap_pref(J,T,map,uVar17,local_70,(uint)*(ushort *)((long)pIVar18 + 10)
                                      );
                    if (TVar16 == 0) {
                      TVar16 = snap_pref(J,T,map,uVar17,local_70,
                                         (uint)T->ir[*(ushort *)((long)pIVar18 + 10)].field_0.op1);
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
                      TVar16 = lj_opt_fold(J);
                    }
                    (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar18 + 0xc);
                    (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
                    lj_opt_fold(J);
                    pIVar18 = irs;
                    goto LAB_0014e600;
                  }
                }
                pcVar1 = (char *)((long)pIVar18 + 0xd);
                pIVar18 = irs;
                if ((*pcVar1 == 'Z') && ((pIVar21->field_1).o == 'S')) {
                  (J->fold).ins.field_0.ot = 0x5a00;
                  (J->fold).ins.field_1.op12 = 0;
                  lj_opt_fold(J);
                }
                goto LAB_0014e600;
              }
              goto LAB_0014e5ac;
            }
            (J->fold).ins.field_0.ot = (pIVar21->field_0).ot & 0xff9f;
            (J->fold).ins.field_0.op1 = uVar24;
            (J->fold).ins.field_0.op2 = uVar11;
            TVar14 = lj_opt_fold(J);
          }
          else {
            TVar14 = J->slot[J->slot[uVar22]];
          }
          J->slot[uVar22] = TVar14;
        }
LAB_0014e5ac:
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar6[uVar4].nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar9) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      if ((sn & SNAP_KEYINDEX)) mode |= IRSLOAD_KEYINDEX;
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    /* Same as TREF_* flags. */
    J->slot[s] = tr | (sn&(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME));
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	if (ir->op1 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op1);
	if (ir->op2 >= T->nk) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	if (op1 >= T->nk) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (op2 >= T->nk) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}